

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

ON_PointCloud * __thiscall ON_PointCloud::operator=(ON_PointCloud *this,ON_PointCloud *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (this != src) {
    Destroy(this);
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    ON_3dPointArray::operator=(&this->m_P,&src->m_P);
    ON_SimpleArray<bool>::operator=(&this->m_H,&src->m_H);
    ON_SimpleArray<ON_Color>::operator=(&this->m_C,&src->m_C);
    ON_SimpleArray<double>::operator=(&this->m_V,&src->m_V);
    ON_SimpleArray<ON_3dVector>::operator=(&this->m_N,&src->m_N);
    this->m_hidden_count = src->m_hidden_count;
    pOVar7 = &src->m_plane;
    pOVar8 = &this->m_plane;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pOVar8->origin).x = (pOVar7->origin).x;
      pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar9 * -0x10 + 8);
      pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    dVar1 = (src->m_bbox).m_min.x;
    dVar2 = (src->m_bbox).m_min.y;
    dVar3 = (src->m_bbox).m_min.z;
    dVar4 = (src->m_bbox).m_max.x;
    dVar5 = (src->m_bbox).m_max.z;
    (this->m_bbox).m_max.y = (src->m_bbox).m_max.y;
    (this->m_bbox).m_max.z = dVar5;
    (this->m_bbox).m_min.z = dVar3;
    (this->m_bbox).m_max.x = dVar4;
    (this->m_bbox).m_min.x = dVar1;
    (this->m_bbox).m_min.y = dVar2;
    this->m_flags = src->m_flags;
  }
  return this;
}

Assistant:

ON_PointCloud& ON_PointCloud::operator=( const ON_PointCloud& src )
{
  if ( this != &src ) {
    Destroy();
    ON_Geometry::operator=(src);
    m_P = src.m_P;
    m_H = src.m_H;
    m_C = src.m_C;
    m_V = src.m_V;
    m_N = src.m_N;
    m_hidden_count = src.m_hidden_count;

    m_plane = src.m_plane;
    m_bbox = src.m_bbox;
    m_flags = src.m_flags;
  }
  return *this;
}